

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

Am_Object am_call_create_placeholder
                    (Am_Object *proto,Am_Value *objs,Am_Object *create_cmd,
                    Am_Value_List *placeholder_list,Am_Value_List *part_chain,int *cnt,
                    Am_Slot_Key slot)

{
  Am_Value *value;
  Am_Wrapper *pAVar1;
  Am_Value AVar2;
  undefined6 in_stack_0000000a;
  Am_Slot_Key in_stack_00000010;
  Am_Placeholder_Create_Method method;
  Am_Assoc AStack_68;
  Am_Value_List *local_60;
  Am_Value_List *local_58;
  Am_Value local_50;
  Am_Placeholder_Create_Method local_40;
  
  local_60 = part_chain;
  local_58 = (Am_Value_List *)cnt;
  value = Am_Object::Get((Am_Object *)objs,Am_PLACEHOLDER_CREATE_METHOD,0);
  Am_Placeholder_Create_Method::Am_Placeholder_Create_Method(&local_40,value);
  Am_Value::Am_Value(&local_50,(Am_Value *)create_cmd);
  AVar2.value.wrapper_value = (Am_Wrapper *)&local_50;
  AVar2._0_8_ = placeholder_list;
  (*local_40.Call)(proto,AVar2,local_58,(int *)CONCAT62(in_stack_0000000a,slot),in_stack_00000010);
  Am_Value::~Am_Value(&local_50);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(proto);
  Am_Assoc::Am_Assoc(&AStack_68,(Am_Value *)create_cmd,pAVar1);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&AStack_68);
  Am_Value_List::Add(local_60,pAVar1,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(&AStack_68);
  return (Am_Object)(Am_Object_Data *)proto;
}

Assistant:

Am_Object
am_call_create_placeholder(Am_Object proto, Am_Value &objs,
                           Am_Object &create_cmd,
                           Am_Value_List &placeholder_list,
                           Am_Value_List &part_chain, int &cnt,
                           Am_Slot_Key slot)
{
  Am_Placeholder_Create_Method method = proto.Get(Am_PLACEHOLDER_CREATE_METHOD);
  Am_Object placeholder = method.Call(create_cmd, objs, part_chain, cnt, slot);
  placeholder_list.Add(Am_Assoc(objs, placeholder));
  return placeholder;
}